

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TitleSpecsOf.hpp
# Opt level: O1

string * __thiscall
sciplot::TitleSpecsOf<sciplot::LegendSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,TitleSpecsOf<sciplot::LegendSpecs> *this)

{
  int iVar1;
  ostream *poVar2;
  stringstream ss;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  iVar1 = std::__cxx11::string::compare((char *)&this->m_title);
  if (iVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"title ",6);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(this->m_title)._M_dataplus._M_p,(this->m_title)._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    TextSpecsOf<sciplot::TextSpecs>::repr_abi_cxx11_
              (&local_1e8,&(this->m_text_specs).super_TextSpecsOf<sciplot::TextSpecs>);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    OffsetSpecsOf<sciplot::OffsetSpecs>::repr_abi_cxx11_
              (&local_1e8,&(this->m_offset_specs).super_OffsetSpecsOf<sciplot::OffsetSpecs>);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

auto TitleSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    if(m_title == "''")
        return "";

    std::stringstream ss;
    ss << "title " << m_title << " ";
    ss << m_text_specs.repr() << " ";
    ss << m_offset_specs.repr();
    return internal::removeExtraWhitespaces(ss.str());
}